

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::replace_fragment_outputs(CompilerGLSL *this)

{
  uint id;
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  bool bVar3;
  SPIRVariable *var;
  SPIRType *pSVar4;
  long lVar5;
  LoopLock loop_lock;
  LoopLock local_40;
  ParsedIR *local_38;
  
  local_38 = &(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock(local_38);
  pTVar1 = (this->super_Compiler).ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar5 = 0; sVar2 << 2 != lVar5; lVar5 = lVar5 + 4) {
    id = *(uint *)((long)&pTVar1->id + lVar5);
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[id].type ==
        TypeVariable) {
      var = ParsedIR::get<spirv_cross::SPIRVariable>(local_38,id);
      pSVar4 = Compiler::get<spirv_cross::SPIRType>
                         (&this->super_Compiler,*(uint32_t *)&(var->super_IVariant).field_0xc);
      bVar3 = Compiler::is_builtin_variable(&this->super_Compiler,var);
      if ((((!bVar3) && (var->remapped_variable == false)) && (pSVar4->pointer == true)) &&
         (var->storage == StorageClassOutput)) {
        replace_fragment_output(this,var);
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock(&local_40);
  return;
}

Assistant:

void CompilerGLSL::replace_fragment_outputs()
{
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		if (!is_builtin_variable(var) && !var.remapped_variable && type.pointer && var.storage == StorageClassOutput)
			replace_fragment_output(var);
	});
}